

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  uint uVar3;
  jpeg_d_coef_controller *pjVar4;
  jpeg_component_info *pjVar5;
  inverse_DCT_method_ptr p_Var6;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  JDIMENSION JVar12;
  JSAMPARRAY ppJVar13;
  ulong uVar14;
  ulong uVar15;
  int local_94;
  uint local_90;
  
  pjVar4 = cinfo->coef;
  iVar10 = *(int *)((long)&pjVar4[1].start_input_pass + 4);
  if (iVar10 < *(int *)&pjVar4[1].consume_data) {
    JVar1 = cinfo->total_iMCU_rows;
    uVar8 = cinfo->MCUs_per_row - 1;
    do {
      local_90 = *(uint *)&pjVar4[1].start_input_pass;
      if (local_90 <= uVar8) {
        do {
          if (cinfo->lim_Se != 0) {
            memset(pjVar4[1].start_output_pass,0,(long)cinfo->blocks_in_MCU << 7);
          }
          bVar7 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar4[1].start_output_pass);
          if (bVar7 == 0) {
            *(int *)((long)&pjVar4[1].start_input_pass + 4) = iVar10;
            *(uint *)&pjVar4[1].start_input_pass = local_90;
            return 0;
          }
          if (0 < cinfo->comps_in_scan) {
            lVar11 = 0;
            local_94 = 0;
            do {
              pjVar5 = cinfo->cur_comp_info[lVar11];
              if (pjVar5->component_needed == 0) {
                local_94 = local_94 + pjVar5->MCU_blocks;
              }
              else if (0 < pjVar5->MCU_height) {
                p_Var6 = cinfo->idct->inverse_DCT[pjVar5->component_index];
                iVar2 = pjVar5->MCU_sample_width;
                uVar3 = (&pjVar5->MCU_width)[(ulong)(uVar8 <= local_90) * 4];
                ppJVar13 = output_buf[pjVar5->component_index] +
                           (long)pjVar5->DCT_v_scaled_size * (long)iVar10;
                uVar14 = 1;
                if (1 < (int)uVar3) {
                  uVar14 = (ulong)uVar3;
                }
                iVar9 = 0;
                do {
                  if (((cinfo->input_iMCU_row < JVar1 - 1) ||
                      (iVar10 + iVar9 < pjVar5->last_row_height)) && (0 < (int)uVar3)) {
                    uVar15 = 0;
                    JVar12 = iVar2 * local_90;
                    do {
                      (*p_Var6)(cinfo,pjVar5,
                                (JCOEFPTR)(&pjVar4[1].start_output_pass)[(long)local_94 + uVar15],
                                ppJVar13,JVar12);
                      JVar12 = JVar12 + pjVar5->DCT_h_scaled_size;
                      uVar15 = uVar15 + 1;
                    } while (uVar14 != uVar15);
                  }
                  local_94 = local_94 + pjVar5->MCU_width;
                  ppJVar13 = ppJVar13 + pjVar5->DCT_v_scaled_size;
                  iVar9 = iVar9 + 1;
                } while (iVar9 < pjVar5->MCU_height);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < cinfo->comps_in_scan);
          }
          local_90 = local_90 + 1;
        } while (local_90 <= uVar8);
      }
      *(undefined4 *)&pjVar4[1].start_input_pass = 0;
      iVar10 = iVar10 + 1;
    } while (iVar10 < *(int *)&pjVar4[1].consume_data);
  }
  cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
  uVar8 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar8;
  if (uVar8 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar10 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar10 = 4;
  }
  return iVar10;
}

Assistant:

METHODDEF(int)
decompress_onepass (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      if (cinfo->lim_Se)	/* can bypass in DC only case */
	FMEMZERO((void FAR *) coef->MCU_buffer[0],
		 (size_t) (cinfo->blocks_in_MCU * SIZEOF(JBLOCK)));
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
      /* Determine where data should go in output_buf and do the IDCT thing.
       * We skip dummy blocks at the right and bottom edges (but blkn gets
       * incremented past them!).  Note the inner loop relies on having
       * allocated the MCU_buffer[] blocks sequentially.
       */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	/* Don't bother to IDCT an uninteresting component. */
	if (! compptr->component_needed) {
	  blkn += compptr->MCU_blocks;
	  continue;
	}
	inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
	useful_width = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						    : compptr->last_col_width;
	output_ptr = output_buf[compptr->component_index] +
	  yoffset * compptr->DCT_v_scaled_size;
	start_col = MCU_col_num * compptr->MCU_sample_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (cinfo->input_iMCU_row < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    output_col = start_col;
	    for (xindex = 0; xindex < useful_width; xindex++) {
	      (*inverse_DCT) (cinfo, compptr,
			      (JCOEFPTR) coef->MCU_buffer[blkn+xindex],
			      output_ptr, output_col);
	      output_col += compptr->DCT_h_scaled_size;
	    }
	  }
	  blkn += compptr->MCU_width;
	  output_ptr += compptr->DCT_v_scaled_size;
	}
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}